

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

void __thiscall
wasm::WalkerPass<wasm::PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>_>
::run(WalkerPass<wasm::PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>_>
      *this,Module *module)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool bVar1;
  PassRunner *pPVar2;
  int iVar3;
  long lVar4;
  PassOptions *pPVar5;
  bool *pbVar6;
  byte bVar7;
  PassOptions local_2a8;
  undefined1 local_1f0 [8];
  PassRunner runner;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_80;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_48;
  __alloc_node_gen_t __alloc_node_gen_2;
  __uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_> local_38;
  
  bVar7 = 0;
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    iVar3 = (*(this->super_Pass)._vptr_Pass[4])();
    if ((char)iVar3 == '\0') {
      (this->super_PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>).
      super_Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>.currModule =
           module;
      Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>::doWalkModule
                (&(this->
                  super_PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>).
                  super_Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>,
                 module);
      RemoveImports::visitModule((RemoveImports *)this,module);
      (this->super_PostWalker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>).
      super_Walker<wasm::RemoveImports,_wasm::Visitor<wasm::RemoveImports,_void>_>.currModule =
           (Module *)0x0;
    }
    else {
      pPVar2 = (this->super_Pass).runner;
      pPVar5 = &pPVar2->options;
      pbVar6 = &runner.isNested;
      __alloc_node_gen_2._M_h = (__hashtable_alloc *)module;
      for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)pbVar6 = *(undefined8 *)pPVar5;
        pPVar5 = (PassOptions *)((long)pPVar5 + (ulong)bVar7 * -0x10 + 8);
        pbVar6 = pbVar6 + (ulong)bVar7 * -0x10 + 8;
      }
      bVar1 = (pPVar2->options).targetJS;
      local_b8._M_buckets = (__buckets_ptr)0x0;
      local_b8._M_bucket_count = (pPVar2->options).arguments._M_h._M_bucket_count;
      local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_b8._M_element_count = (pPVar2->options).arguments._M_h._M_element_count;
      local_b8._M_rehash_policy._M_max_load_factor =
           (pPVar2->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
      local_b8._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar2->options).arguments._M_h._M_rehash_policy.field_0x4;
      local_b8._M_rehash_policy._M_next_resize =
           (pPVar2->options).arguments._M_h._M_rehash_policy._M_next_resize;
      local_b8._M_single_bucket = (__node_base_ptr)0x0;
      local_1f0 = (undefined1  [8])&local_b8;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_b8,&(pPVar2->options).arguments._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                  *)local_1f0);
      local_1f0 = (undefined1  [8])&local_80;
      local_80._M_buckets = (__buckets_ptr)0x0;
      local_80._M_bucket_count = (pPVar2->options).passesToSkip._M_h._M_bucket_count;
      local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_80._M_element_count = (pPVar2->options).passesToSkip._M_h._M_element_count;
      local_80._M_rehash_policy._M_max_load_factor =
           (pPVar2->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
      local_80._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar2->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
      local_80._M_rehash_policy._M_next_resize =
           (pPVar2->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
      local_80._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_1f0,&(pPVar2->options).passesToSkip._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)local_1f0);
      runner._236_4_ =
           ~-(uint)((int)runner._236_4_ < 1) & 1 | runner._236_4_ & -(uint)((int)runner._236_4_ < 1)
      ;
      pbVar6 = &runner.isNested;
      pPVar5 = &local_2a8;
      for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)pPVar5 = *(undefined8 *)pbVar6;
        pbVar6 = pbVar6 + (ulong)bVar7 * -0x10 + 8;
        pPVar5 = (PassOptions *)((long)pPVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      }
      this_00 = &local_2a8.arguments;
      local_2a8.arguments._M_h._M_buckets = (__buckets_ptr)0x0;
      local_2a8.arguments._M_h._M_bucket_count = local_b8._M_bucket_count;
      local_2a8.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_2a8.arguments._M_h._M_element_count = local_b8._M_element_count;
      local_2a8.arguments._M_h._M_rehash_policy._M_max_load_factor =
           local_b8._M_rehash_policy._M_max_load_factor;
      local_2a8.arguments._M_h._M_rehash_policy._4_4_ = local_b8._M_rehash_policy._4_4_;
      local_2a8.arguments._M_h._M_rehash_policy._M_next_resize =
           local_b8._M_rehash_policy._M_next_resize;
      local_2a8.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_2a8.targetJS = bVar1;
      local_48._M_h = (__hashtable_alloc *)this_00;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_00,&local_b8,&local_48);
      this_01 = &local_2a8.passesToSkip;
      local_2a8.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
      local_2a8.passesToSkip._M_h._M_bucket_count = local_80._M_bucket_count;
      local_2a8.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_2a8.passesToSkip._M_h._M_element_count = local_80._M_element_count;
      local_2a8.passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
           local_80._M_rehash_policy._M_max_load_factor;
      local_2a8.passesToSkip._M_h._M_rehash_policy._4_4_ = local_80._M_rehash_policy._4_4_;
      local_2a8.passesToSkip._M_h._M_rehash_policy._M_next_resize =
           local_80._M_rehash_policy._M_next_resize;
      local_2a8.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_48._M_h = (__hashtable_alloc *)this_01;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_01,&local_80,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)&local_48);
      PassRunner::PassRunner((PassRunner *)local_1f0,(Module *)__alloc_node_gen_2._M_h,&local_2a8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&this_01->_M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&this_00->_M_h);
      runner.options.passesToSkip._M_h._M_single_bucket._0_1_ = 1;
      (*(this->super_Pass)._vptr_Pass[5])(&local_38,this);
      PassRunner::add((PassRunner *)local_1f0,
                      (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_38);
      if ((_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
          local_38._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl != (Pass *)0x0) {
        (**(code **)(*(long *)local_38._M_t.
                              super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                              .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8))();
      }
      local_38._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
           (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
           (_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)0x0;
      PassRunner::run((PassRunner *)local_1f0);
      PassRunner::~PassRunner((PassRunner *)local_1f0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_80);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_b8);
    }
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x203,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::RemoveImports>>::run(Module *) [WalkerType = wasm::PostWalker<wasm::RemoveImports>]"
               );
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }